

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O3

void __thiscall
llbuild::core::BuildEngine::addCancellationDelegate(BuildEngine *this,CancellationDelegate *del)

{
  void *pvVar1;
  int iVar2;
  DenseSetEmpty Empty;
  DenseSetEmpty local_31;
  CancellationDelegate *local_30;
  pair<llvm::DenseMapIterator<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>,_false>,_bool>
  local_28;
  
  pvVar1 = this->impl;
  local_30 = del;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)((long)pvVar1 + 0x90));
  if (iVar2 == 0) {
    if ((*(byte *)((long)pvVar1 + 200) & 1) == 0) {
      llvm::
      DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>,llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>
      ::try_emplace<llvm::detail::DenseSetEmpty&>
                (&local_28,
                 (DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>,llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>
                  *)((long)pvVar1 + 0xf8),&local_30,&local_31);
    }
    else {
      (*local_30->_vptr_CancellationDelegate[2])();
    }
    pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar1 + 0x90));
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void BuildEngine::addCancellationDelegate(CancellationDelegate* del) {
  static_cast<BuildEngineImpl*>(impl)->addCancellationDelegate(std::move(del));
}